

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

void Gia_MuxStructPrint_rec(Gia_Man_t *p,int iObj,int fFirst)

{
  uint *puVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar5 = p->pObjs + (uint)iObj;
  puVar1 = p->pMuxes;
  if (fFirst == 0) {
    if (((puVar1 == (uint *)0x0) || (puVar1[(uint)iObj] == 0)) || (0 < p->pRefs[(uint)iObj])) {
      uVar3 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iObj);
      printf("<%02d>",(ulong)uVar3);
      return;
    }
LAB_0021e6a8:
    uVar3 = puVar1[(uint)iObj];
    if (uVar3 == 0) goto LAB_0021e6b9;
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar3 = uVar3 >> 1;
  }
  else {
    if (puVar1 != (uint *)0x0) goto LAB_0021e6a8;
LAB_0021e6b9:
    uVar3 = 0xffffffff;
  }
  printf(" [(");
  if (((p->pMuxes == (uint *)0x0) || (p->pMuxes[(int)uVar3] == 0)) || (p->pRefs[(int)uVar3] != 0)) {
    printf("%d",(ulong)uVar3);
    uVar3 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,uVar3);
    printf("<%d>",(ulong)uVar3);
  }
  else {
    Gia_MuxStructPrint_rec(p,uVar3,0);
  }
  putchar(0x29);
  pGVar2 = p->pObjs;
  if (p->pMuxes != (uint *)0x0) {
    if ((pGVar5 < pGVar2) || (pGVar2 + p->nObjs <= pGVar5)) goto LAB_0021e8d9;
    iVar4 = (int)((long)pGVar5 - (long)pGVar2 >> 2) * -0x55555555;
    uVar3 = p->pMuxes[iVar4];
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((uVar3 & 1) != 0) {
      Gia_MuxStructPrint_rec(p,iVar4 - (*(uint *)pGVar5 & 0x1fffffff),0);
      putchar(0x7c);
      pGVar2 = p->pObjs;
      if ((pGVar5 < pGVar2) || (pGVar2 + p->nObjs <= pGVar5)) goto LAB_0021e8d9;
      iVar4 = (int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2);
      uVar3 = *(uint *)&pGVar5->field_0x4;
      goto LAB_0021e89f;
    }
  }
  if ((pGVar2 <= pGVar5) && (pGVar5 < pGVar2 + p->nObjs)) {
    Gia_MuxStructPrint_rec
              (p,(int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2) * -0x55555555 -
                 (*(uint *)&pGVar5->field_0x4 & 0x1fffffff),0);
    putchar(0x7c);
    pGVar2 = p->pObjs;
    if ((pGVar2 <= pGVar5) && (pGVar5 < pGVar2 + p->nObjs)) {
      iVar4 = (int)((ulong)((long)pGVar5 - (long)pGVar2) >> 2);
      uVar3 = *(uint *)pGVar5;
LAB_0021e89f:
      Gia_MuxStructPrint_rec(p,iVar4 * -0x55555555 - (uVar3 & 0x1fffffff),0);
      putchar(0x5d);
      return;
    }
  }
LAB_0021e8d9:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_MuxStructPrint_rec( Gia_Man_t * p, int iObj, int fFirst )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    int iCtrl;
    if ( !fFirst && (!Gia_ObjIsMuxId(p, iObj) || Gia_ObjRefNumId(p, iObj) > 0) )
    {
//        printf( "%d", iObj );
        printf( "<%02d>", Gia_ObjLevelId(p, iObj) );
        return;
    }
    iCtrl = Gia_ObjFaninId2p(p, pObj);
    printf( " [(" );
    if ( Gia_ObjIsMuxId(p, iCtrl) && Gia_ObjRefNumId(p, iCtrl) == 0 )
        Gia_MuxStructPrint_rec( p, iCtrl, 0 );
    else
    {
        printf( "%d", iCtrl );
        printf( "<%d>", Gia_ObjLevelId(p, iCtrl) );
    }
    printf( ")" );
    if ( Gia_ObjFaninC2(p, pObj) )
    {
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId0p(p, pObj), 0 );
        printf( "|" );
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId1p(p, pObj), 0 );
        printf( "]" );
    }
    else
    {
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId1p(p, pObj), 0 );
        printf( "|" );
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId0p(p, pObj), 0 );
        printf( "]" );
    }
}